

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

ssize_t dma_read(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  ulong uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  undefined1 *__src;
  void *__dest;
  ushort uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  tlp_cpl_hdr ch;
  pollfd x [1];
  uint64_t dst_addr64;
  iovec iov [4];
  nettlp_hdr nh;
  nettlp_hdr nh_1;
  char rest [16];
  ushort local_f0;
  ushort uStack_ee;
  undefined4 uStack_ec;
  byte local_e4 [2];
  ushort local_e2;
  ushort local_de;
  byte local_d9;
  pollfd local_d8;
  ulong local_d0;
  iovec local_c8;
  byte *local_b8;
  undefined8 local_b0;
  void *local_a8;
  long local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined4 local_84;
  undefined2 local_80;
  undefined1 local_7e [6];
  iovec local_78;
  ushort *local_68;
  undefined8 local_60;
  ulong *local_58;
  undefined8 local_50;
  undefined1 local_48 [24];
  
  local_78.iov_base = &local_84;
  local_84 = 0;
  local_80 = 0;
  local_68 = &local_f0;
  local_78.iov_len = 6;
  local_60 = 8;
  uVar7 = (uint)addr;
  if (addr < 0xffffffff) {
    uVar5 = (ulong)(uVar7 & 0xfffffffc);
    local_d0 = CONCAT44(local_d0._4_4_,
                        uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                        (uVar7 & 0xfffffffc) << 0x18);
    local_50 = 4;
    bVar6 = 0;
  }
  else {
    uVar5 = addr & 0xfffffffffffffffc;
    local_d0 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18 |
               (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18 |
               (addr & 0xff00) << 0x28 | uVar5 << 0x38;
    local_50 = 8;
    bVar6 = 0x20;
  }
  local_58 = &local_d0;
  uVar1 = count + addr;
  bVar13 = (uVar1 & 3) != 0;
  uVar12 = (count - 4) + addr;
  if (bVar13) {
    uVar12 = uVar1 & 0xfffffffffffffffc;
  }
  if (uVar12 <= uVar5) {
    uVar12 = addr + 4;
  }
  bVar8 = ~(byte)(0xf << ((char)uVar1 - (char)uVar12 & 0x1fU)) << 4;
  if (uVar1 < uVar12) {
    bVar8 = 0;
  }
  uVar9 = ~(0xf << ((byte)count & 0x1f)) & 7;
  if (3 < count) {
    uVar9 = 0xf;
  }
  uVar10 = (ushort)bVar13 + (short)((int)uVar1 - (uVar7 & 0x3fffc) >> 2);
  _local_f0 = CONCAT44(CONCAT13((byte)(uVar9 << ((byte)addr & 3)) & 0xf | bVar8,
                                CONCAT12(nt->tag,nt->requester << 8 | nt->requester >> 8)),
                       CONCAT22(uVar10 * 0x100 | uVar10 >> 8,(ushort)bVar6));
  sVar3 = writev(nt->sockfd,&local_78,3);
  iVar2 = (int)sVar3;
  if (-1 < iVar2) {
    local_c8.iov_base = local_7e;
    local_c8.iov_len = 6;
    local_b8 = local_e4;
    local_b0 = 0xc;
    local_98 = local_48;
    local_90 = 0x10;
    local_d8.fd = nt->sockfd;
    local_d8.events = 1;
    iVar2 = poll(&local_d8,1,500);
    if (-1 < iVar2) {
      lVar11 = 0;
      do {
        if (iVar2 == 0) {
          iVar2 = 0x3e;
LAB_00102c67:
          piVar4 = __errno_location();
          *piVar4 = iVar2;
          iVar2 = -1;
          break;
        }
        if (((byte)local_d8.revents & 1) == 0) break;
        local_a8 = (void *)((long)buf + lVar11);
        local_a0 = count - lVar11;
        sVar3 = readv(nt->sockfd,&local_c8,4);
        iVar2 = (int)sVar3;
        if (iVar2 < 0) break;
        if ((local_e4[0] & 0x5f) != 0x4a) {
          iVar2 = 0x4a;
          goto LAB_00102c67;
        }
        uVar7 = (uint)(ushort)(local_de << 8 | local_de >> 8);
        if (0x1fff < uVar7) {
          uVar9 = uVar7 & 0xe000;
          if (uVar9 == 0x2000) {
            iVar2 = 0x5f;
          }
          else if (uVar9 == 0x4000) {
            iVar2 = 0x16;
          }
          else {
            if (uVar9 != 0x8000) goto LAB_00102b82;
            iVar2 = 0x67;
          }
          goto LAB_00102c67;
        }
LAB_00102b82:
        if ((local_d9 & 3) != 0) {
          iVar2 = (int)((ulong)local_d9 & 3);
          uVar9 = (int)local_a0 - iVar2;
          if ((int)uVar9 < 1) {
            __src = local_98 + (iVar2 - (int)local_a0);
            uVar7 = uVar7 & 0xfff;
            __dest = local_a8;
          }
          else {
            uVar5 = (ulong)(uVar9 & 0x7fffffff);
            memmove(local_a8,(void *)(((ulong)local_d9 & 3) + (long)local_a8),uVar5);
            uVar7 = local_d9 & 3;
            __src = local_98;
            __dest = (void *)(uVar5 + (long)local_a8);
          }
          memmove(__dest,__src,(ulong)uVar7);
        }
        uVar7 = (uint)(ushort)(local_e2 << 8 | local_e2 >> 8);
        uVar10 = (local_de & 0xff0f) << 8 | local_de >> 8;
        if ((local_d9 & 3) + (uint)uVar10 + 3 >> 2 == (uVar7 & 0x3ff)) {
          return lVar11 + (ulong)uVar10;
        }
        lVar11 = lVar11 + (ulong)(uVar7 & 0x3ff) * 4;
        iVar2 = poll(&local_d8,1,500);
      } while (-1 < iVar2);
    }
  }
  return (long)iVar2;
}

Assistant:

ssize_t dma_read(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret;
	struct iovec iov[3];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);

	/* build memory read request  */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MRd);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_WO_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_WO_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));
	

	ret = writev(nt->sockfd, iov, 3);
	if (ret < 0)
		return ret;

	return libtlp_read_cpld(nt, buf, count);
}